

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TriangularSolverMatrix.h
# Opt level: O1

void Eigen::internal::triangular_solve_matrix<double,_long,_1,_5,_false,_0,_0,_1>::run
               (long size,long otherSize,double *_tri,long triStride,double *_other,long otherIncr,
               long otherStride,level3_blocking<double,_double> *blocking)

{
  double dVar1;
  RhsScalar *pRVar2;
  ulong stride;
  int iVar3;
  LhsScalar *pLVar4;
  ulong uVar5;
  undefined8 *puVar6;
  ulong uVar7;
  double *pdVar8;
  long lVar9;
  double *pdVar10;
  long lVar11;
  LhsScalar *pLVar12;
  double *pdVar13;
  double *pdVar14;
  double *pdVar15;
  double *pdVar16;
  long lVar17;
  long lVar18;
  ulong uVar19;
  double dStack_198;
  long local_190;
  ulong local_188;
  long local_180;
  long local_178;
  long local_170;
  ulong local_168;
  ulong local_160;
  long local_158;
  long local_150;
  RhsScalar *local_148;
  double *local_140;
  double *local_138;
  double *local_130;
  double *local_128;
  double *local_120;
  long local_118;
  double *local_110;
  double *local_108;
  double *local_100;
  ulong local_f8;
  LhsScalar *local_f0;
  RhsScalar *local_e8;
  double *local_e0;
  double *local_d8;
  double *local_d0;
  long local_c8;
  long local_c0;
  double *local_b8;
  long local_b0;
  ulong local_a8;
  double *local_a0;
  long local_98;
  long local_90;
  RhsScalar *local_88;
  ulong local_80;
  double *local_78;
  long local_70;
  ulong local_68;
  long local_60;
  ulong local_58;
  LhsScalar *local_50;
  blas_data_mapper<double,_long,_0,_0,_1> local_48;
  gemm_pack_rhs<double,_long,_Eigen::internal::blas_data_mapper<double,_long,_0,_0,_1>,_4,_0,_false,_true>
  local_33;
  gebp_kernel<double,_double,_long,_Eigen::internal::blas_data_mapper<double,_long,_0,_0,_1>,_4,_4,_false,_false>
  local_32;
  gemm_pack_lhs<double,_long,_Eigen::internal::const_blas_data_mapper<double,_long,_0>,_4,_2,___attribute__((__vector_size__(2_*_sizeof(double))))_double,_0,_false,_false>
  local_31 [6];
  gemm_pack_rhs<double,_long,_Eigen::internal::blas_data_mapper<double,_long,_0,_0,_1>,_4,_0,_false,_true>
  pack_rhs;
  gebp_kernel<double,_double,_long,_Eigen::internal::blas_data_mapper<double,_long,_0,_0,_1>,_4,_4,_false,_false>
  gebp_kernel;
  gemm_pack_lhs<double,_long,_Eigen::internal::const_blas_data_mapper<double,_long,_0>,_4,_2,___attribute__((__vector_size__(2_*_sizeof(double))))_double,_0,_false,_false>
  pack_lhs;
  
  pLVar12 = &dStack_198;
  local_c0 = triStride;
  local_130 = _tri;
  if (otherIncr != 1) {
    __assert_fail("incr==1",
                  "/workspace/llm4binary/github/license_c_cmakelists/ebu[P]libear/submodules/eigen/Eigen/src/Core/util/BlasUtil.h"
                  ,0xae,
                  "Eigen::internal::blas_data_mapper<double, long, 0>::blas_data_mapper(Scalar *, Index, Index) [Scalar = double, Index = long, StorageOrder = 0, AlignmentType = 0, Incr = 1]"
                 );
  }
  local_58 = size;
  lVar9 = blocking->m_mc;
  if (size <= blocking->m_mc) {
    lVar9 = size;
  }
  uVar19 = lVar9 * blocking->m_kc;
  if (uVar19 >> 0x3d != 0) {
LAB_001603e6:
    puVar6 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar6 = std::random_device::_M_fini;
    __cxa_throw(puVar6,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
  local_b0 = lVar9;
  local_80 = blocking->m_kc;
  if (blocking->m_blockA == (LhsScalar *)0x0) {
    if (uVar19 < 0x4001) {
      pLVar4 = (LhsScalar *)((long)&dStack_198 - (uVar19 * 8 + 0x1e & 0xfffffffffffffff0));
      local_50 = pLVar4;
      pLVar12 = pLVar4;
    }
    else {
      pLVar4 = (LhsScalar *)malloc(uVar19 * 8);
      if (((ulong)pLVar4 & 0xf) != 0) goto LAB_00160481;
      local_50 = pLVar4;
      pLVar12 = &dStack_198;
      if (pLVar4 == (LhsScalar *)0x0) goto LAB_001603e6;
    }
  }
  else {
    local_50 = blocking->m_blockA;
    pLVar4 = (LhsScalar *)0x0;
    pLVar12 = &dStack_198;
  }
  uVar7 = local_80 * otherSize;
  local_a8 = uVar7;
  if (0x1fffffffffffffff < uVar7) {
    pLVar12[-1] = 7.12860640839459e-318;
    puVar6 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar6 = std::random_device::_M_fini;
    pLVar12[-1] = 7.12878427202709e-318;
    __cxa_throw(puVar6,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
  local_88 = blocking->m_blockB;
  if (blocking->m_blockB == (RhsScalar *)0x0) {
    if (uVar7 < 0x4001) {
      local_e8 = (RhsScalar *)((long)pLVar12 - (uVar7 * 8 + 0x1e & 0xfffffffffffffff0));
      local_88 = local_e8;
      pLVar12 = local_e8;
    }
    else {
      pLVar12[-1] = 7.11995037827945e-318;
      local_e8 = (RhsScalar *)malloc(uVar7 * 8);
      if (((ulong)local_e8 & 0xf) != 0) {
LAB_00160481:
        *(undefined8 *)((long)pLVar12 + -8) = 0x1604a0;
        __assert_fail("(size<16 || (std::size_t(result)%16)==0) && \"System\'s malloc returned an unaligned pointer. Compile with EIGEN_MALLOC_ALREADY_ALIGNED=0 to fallback to handmade aligned memory allocator.\""
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/ebu[P]libear/submodules/eigen/Eigen/src/Core/util/Memory.h"
                      ,0xb9,"void *Eigen::internal::aligned_malloc(std::size_t)");
      }
      local_88 = local_e8;
      if (local_e8 == (RhsScalar *)0x0) {
        pLVar12[-1] = 7.12929810029877e-318;
        puVar6 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar6 = std::random_device::_M_fini;
        pLVar12[-1] = (LhsScalar)&LAB_001604ce;
        __cxa_throw(puVar6,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
      }
    }
  }
  else {
    local_e8 = (RhsScalar *)0x0;
  }
  local_f8 = uVar19;
  local_90 = otherSize;
  local_f0 = pLVar4;
  if (manage_caching_sizes(Eigen::Action,long*,long*,long*)::m_cacheSizes == '\0') {
    pLVar12[-1] = 7.1288435599046e-318;
    iVar3 = __cxa_guard_acquire();
    if (iVar3 != 0) {
      pLVar12[-1] = 7.12894237303376e-318;
      CacheSizes::CacheSizes
                ((CacheSizes *)&manage_caching_sizes(Eigen::Action,long*,long*,long*)::m_cacheSizes)
      ;
      pLVar12[-1] = 7.12900166091127e-318;
      __cxa_guard_release();
      otherSize = local_90;
    }
  }
  if (otherSize < 1) {
    pdVar14 = (double *)0x0;
  }
  else {
    uVar19 = local_58;
    if ((long)local_58 < otherStride) {
      uVar19 = otherStride;
    }
    uVar7 = DAT_0021ac00 / (uVar19 << 5);
    uVar19 = uVar7 + 3;
    if (-1 < (long)uVar7) {
      uVar19 = uVar7;
    }
    pdVar14 = (double *)(uVar19 & 0xfffffffffffffffc);
  }
  if ((long)pdVar14 < 5) {
    pdVar14 = (double *)0x4;
  }
  if (0 < (long)local_58) {
    local_120 = local_130 + 1;
    local_190 = local_c0 * 8 + 8;
    local_158 = local_80 * local_190;
    local_180 = local_c0 * 0x20 + 0x20;
    local_100 = _other + 1;
    local_150 = local_80 * 8;
    local_178 = otherStride * (long)pdVar14 * 8;
    local_118 = local_58 - local_80;
    local_110 = _other + local_80;
    local_170 = local_b0 * 8;
    local_108 = local_130 + local_80;
    local_60 = 0;
    local_128 = pdVar14;
    uVar19 = local_58;
    uVar7 = local_58;
    do {
      local_160 = uVar7;
      if ((long)local_80 < (long)uVar7) {
        uVar7 = local_80;
      }
      local_168 = uVar7;
      uVar7 = uVar19 - local_60;
      if ((long)local_80 < (long)(uVar19 - local_60)) {
        uVar7 = local_80;
      }
      local_68 = uVar7;
      if (0 < otherSize) {
        local_b8 = local_100;
        lVar9 = 0;
        do {
          local_70 = lVar9;
          local_a0 = (double *)(otherSize - lVar9);
          pdVar14 = local_a0;
          if ((long)local_128 < (long)local_a0) {
            pdVar14 = local_128;
          }
          local_d0 = pdVar14;
          if (0 < (long)uVar7) {
            local_148 = local_88 + lVar9 * uVar7;
            local_140 = _other + lVar9 * otherStride;
            local_138 = local_b8;
            local_d8 = local_120;
            lVar11 = 0;
            uVar19 = local_168;
            do {
              stride = local_68;
              pdVar15 = local_d0;
              pRVar2 = local_148;
              local_188 = uVar19;
              uVar5 = 4;
              if ((long)uVar19 < 4) {
                uVar5 = uVar19;
              }
              if ((long)uVar5 < 2) {
                uVar5 = 1;
              }
              local_98 = lVar11;
              local_e0 = (double *)(uVar7 - lVar11);
              pdVar8 = (double *)0x4;
              if ((long)local_e0 < 4) {
                pdVar8 = local_e0;
              }
              local_78 = pdVar8;
              if (0 < (long)local_e0) {
                uVar19 = 0;
                pdVar10 = local_138;
                pdVar13 = local_d8;
                do {
                  if (0 < (long)local_a0) {
                    pdVar16 = pdVar10;
                    lVar17 = local_70;
                    do {
                      if (0 < (long)(~uVar19 + (long)pdVar8)) {
                        dVar1 = _other[lVar17 * otherStride + local_60 + lVar11 + uVar19];
                        lVar18 = 0;
                        do {
                          pdVar16[lVar18] = pdVar13[lVar18] * -dVar1 + pdVar16[lVar18];
                          lVar18 = lVar18 + 1;
                        } while (lVar18 < (long)(~uVar19 + (long)pdVar8));
                      }
                      lVar17 = lVar17 + 1;
                      pdVar16 = pdVar16 + otherStride;
                    } while (lVar17 < (long)pdVar14 + lVar9);
                  }
                  uVar19 = uVar19 + 1;
                  pdVar13 = (double *)((long)pdVar13 + local_190);
                  pdVar10 = pdVar10 + 1;
                } while (uVar19 != uVar5);
              }
              local_c8 = lVar11 + local_60;
              local_48.m_data = local_140 + lVar11 + local_60;
              local_48.m_stride = otherStride;
              pLVar12[-2] = (LhsScalar)lVar11;
              pLVar12[-3] = 7.12424380874181e-318;
              gemm_pack_rhs<double,_long,_Eigen::internal::blas_data_mapper<double,_long,_0,_0,_1>,_4,_0,_false,_true>
              ::operator()(&local_33,pRVar2,&local_48,(long)pdVar8,(long)pdVar15,stride,
                           (long)pLVar12[-2]);
              pLVar4 = local_50;
              pdVar15 = (double *)((long)local_e0 - (long)pdVar8);
              if (0 < (long)pdVar15) {
                lVar11 = (long)pdVar8 + local_c8;
                lVar17 = local_c8 * local_c0;
                local_c8 = lVar11;
                local_48.m_data = local_130 + lVar17 + lVar11;
                local_48.m_stride = local_c0;
                local_e0 = pdVar15;
                pLVar12[-2] = 0.0;
                pLVar12[-3] = 7.12480704357807e-318;
                gemm_pack_lhs<double,_long,_Eigen::internal::const_blas_data_mapper<double,_long,_0>,_4,_2,___attribute__((__vector_size__(2_*_sizeof(double))))_double,_0,_false,_false>
                ::operator()(local_31,pLVar4,(const_blas_data_mapper<double,_long,_0> *)&local_48,
                             (long)pdVar8,(long)pdVar15,0,(long)pLVar12[-2]);
                pLVar4 = local_50;
                pdVar8 = local_78;
                pdVar15 = local_e0;
                pRVar2 = local_148;
                local_48.m_data = local_140 + local_c8;
                local_48.m_stride = otherStride;
                pLVar12[-2] = (LhsScalar)local_98;
                pLVar12[-3] = 0.0;
                pLVar12[-4] = (LhsScalar)local_68;
                pLVar12[-5] = (LhsScalar)pdVar8;
                pLVar12[-6] = (LhsScalar)local_d0;
                pLVar12[-7] = 7.12527640594162e-318;
                gebp_kernel<double,_double,_long,_Eigen::internal::blas_data_mapper<double,_long,_0,_0,_1>,_4,_4,_false,_false>
                ::operator()(&local_32,&local_48,pLVar4,pRVar2,(long)pdVar15,(long)pdVar8,
                             (long)pLVar12[-6],-1.0,(long)pLVar12[-5],(long)pLVar12[-4],
                             (long)pLVar12[-3],(long)pLVar12[-2]);
              }
              lVar11 = local_98 + 4;
              uVar19 = local_188 - 4;
              local_d8 = (double *)((long)local_d8 + local_180);
              local_138 = local_138 + 4;
              uVar7 = local_68;
            } while (lVar11 < (long)local_68);
          }
          lVar9 = local_70 + (long)local_128;
          local_b8 = (double *)((long)local_b8 + local_178);
          otherSize = local_90;
        } while (lVar9 < local_90);
      }
      lVar11 = local_60 + local_80;
      local_60 = lVar11;
      uVar19 = local_58;
      pdVar14 = local_108;
      pdVar15 = local_110;
      lVar9 = local_118;
      if (lVar11 < (long)local_58) {
        do {
          pLVar4 = local_50;
          lVar18 = lVar9 - local_b0;
          lVar17 = lVar9;
          if (local_b0 <= lVar9) {
            lVar17 = local_b0;
          }
          lVar9 = lVar18;
          if (0 < lVar17) {
            local_70 = lVar18;
            local_a0 = pdVar15;
            local_78 = pdVar14;
            local_48.m_data = pdVar14;
            local_48.m_stride = local_c0;
            pLVar12[-2] = 0.0;
            pLVar12[-3] = 7.12658073924664e-318;
            gemm_pack_lhs<double,_long,_Eigen::internal::const_blas_data_mapper<double,_long,_0>,_4,_2,___attribute__((__vector_size__(2_*_sizeof(double))))_double,_0,_false,_false>
            ::operator()(local_31,pLVar4,(const_blas_data_mapper<double,_long,_0> *)&local_48,uVar7,
                         lVar17,0,(long)pLVar12[-2]);
            local_48.m_data = local_a0;
            local_48.m_stride = otherStride;
            pLVar12[-3] = 0.0;
            pLVar12[-2] = 0.0;
            pLVar12[-4] = -NAN;
            pLVar12[-5] = -NAN;
            pLVar12[-6] = (LhsScalar)local_90;
            pLVar4 = local_50;
            uVar19 = local_68;
            pRVar2 = local_88;
            pLVar12[-7] = 7.12705998292311e-318;
            gebp_kernel<double,_double,_long,_Eigen::internal::blas_data_mapper<double,_long,_0,_0,_1>,_4,_4,_false,_false>
            ::operator()(&local_32,&local_48,pLVar4,pRVar2,lVar17,uVar19,(long)pLVar12[-6],-1.0,
                         (long)pLVar12[-5],(long)pLVar12[-4],(long)pLVar12[-3],(long)pLVar12[-2]);
            uVar19 = local_58;
            pdVar14 = local_78;
            pdVar15 = local_a0;
            uVar7 = local_68;
            lVar9 = local_70;
          }
          lVar11 = lVar11 + local_b0;
          pdVar15 = (double *)((long)pdVar15 + local_170);
          pdVar14 = (double *)((long)pdVar14 + local_170);
        } while (lVar11 < (long)uVar19);
      }
      uVar7 = local_160 - local_80;
      local_120 = (double *)((long)local_120 + local_158);
      local_100 = (double *)((long)local_100 + local_150);
      local_118 = local_118 - local_80;
      local_110 = (double *)((long)local_110 + local_150);
      local_108 = (double *)((long)local_108 + local_158);
      otherSize = local_90;
    } while (local_60 < (long)uVar19);
  }
  pRVar2 = local_e8;
  if (0x4000 < local_a8) {
    pLVar12[-1] = 7.12797894502437e-318;
    free(pRVar2);
  }
  pLVar4 = local_f0;
  if (0x4000 < local_f8) {
    pLVar12[-1] = 7.12810246143583e-318;
    free(pLVar4);
  }
  return;
}

Assistant:

EIGEN_DONT_INLINE void triangular_solve_matrix<Scalar,Index,OnTheLeft,Mode,Conjugate,TriStorageOrder,ColMajor,OtherInnerStride>::run(
    Index size, Index otherSize,
    const Scalar* _tri, Index triStride,
    Scalar* _other, Index otherIncr, Index otherStride,
    level3_blocking<Scalar,Scalar>& blocking)
  {
    Index cols = otherSize;

    typedef const_blas_data_mapper<Scalar, Index, TriStorageOrder> TriMapper;
    typedef blas_data_mapper<Scalar, Index, ColMajor, Unaligned, OtherInnerStride> OtherMapper;
    TriMapper tri(_tri, triStride);
    OtherMapper other(_other, otherStride, otherIncr);

    typedef gebp_traits<Scalar,Scalar> Traits;

    enum {
      SmallPanelWidth   = EIGEN_PLAIN_ENUM_MAX(Traits::mr,Traits::nr),
      IsLower = (Mode&Lower) == Lower
    };

    Index kc = blocking.kc();                   // cache block size along the K direction
    Index mc = (std::min)(size,blocking.mc());  // cache block size along the M direction

    std::size_t sizeA = kc*mc;
    std::size_t sizeB = kc*cols;

    ei_declare_aligned_stack_constructed_variable(Scalar, blockA, sizeA, blocking.blockA());
    ei_declare_aligned_stack_constructed_variable(Scalar, blockB, sizeB, blocking.blockB());

    conj_if<Conjugate> conj;
    gebp_kernel<Scalar, Scalar, Index, OtherMapper, Traits::mr, Traits::nr, Conjugate, false> gebp_kernel;
    gemm_pack_lhs<Scalar, Index, TriMapper, Traits::mr, Traits::LhsProgress, typename Traits::LhsPacket4Packing, TriStorageOrder> pack_lhs;
    gemm_pack_rhs<Scalar, Index, OtherMapper, Traits::nr, ColMajor, false, true> pack_rhs;

    // the goal here is to subdivise the Rhs panels such that we keep some cache
    // coherence when accessing the rhs elements
    std::ptrdiff_t l1, l2, l3;
    manage_caching_sizes(GetAction, &l1, &l2, &l3);
    Index subcols = cols>0 ? l2/(4 * sizeof(Scalar) * std::max<Index>(otherStride,size)) : 0;
    subcols = std::max<Index>((subcols/Traits::nr)*Traits::nr, Traits::nr);

    for(Index k2=IsLower ? 0 : size;
        IsLower ? k2<size : k2>0;
        IsLower ? k2+=kc : k2-=kc)
    {
      const Index actual_kc = (std::min)(IsLower ? size-k2 : k2, kc);

      // We have selected and packed a big horizontal panel R1 of rhs. Let B be the packed copy of this panel,
      // and R2 the remaining part of rhs. The corresponding vertical panel of lhs is split into
      // A11 (the triangular part) and A21 the remaining rectangular part.
      // Then the high level algorithm is:
      //  - B = R1                    => general block copy (done during the next step)
      //  - R1 = A11^-1 B             => tricky part
      //  - update B from the new R1  => actually this has to be performed continuously during the above step
      //  - R2 -= A21 * B             => GEPP

      // The tricky part: compute R1 = A11^-1 B while updating B from R1
      // The idea is to split A11 into multiple small vertical panels.
      // Each panel can be split into a small triangular part T1k which is processed without optimization,
      // and the remaining small part T2k which is processed using gebp with appropriate block strides
      for(Index j2=0; j2<cols; j2+=subcols)
      {
        Index actual_cols = (std::min)(cols-j2,subcols);
        // for each small vertical panels [T1k^T, T2k^T]^T of lhs
        for (Index k1=0; k1<actual_kc; k1+=SmallPanelWidth)
        {
          Index actualPanelWidth = std::min<Index>(actual_kc-k1, SmallPanelWidth);
          // tr solve
          for (Index k=0; k<actualPanelWidth; ++k)
          {
            // TODO write a small kernel handling this (can be shared with trsv)
            Index i  = IsLower ? k2+k1+k : k2-k1-k-1;
            Index rs = actualPanelWidth - k - 1; // remaining size
            Index s  = TriStorageOrder==RowMajor ? (IsLower ? k2+k1 : i+1)
                                                 :  IsLower ? i+1 : i-rs;

            Scalar a = (Mode & UnitDiag) ? Scalar(1) : Scalar(1)/conj(tri(i,i));
            for (Index j=j2; j<j2+actual_cols; ++j)
            {
              if (TriStorageOrder==RowMajor)
              {
                Scalar b(0);
                const Scalar* l = &tri(i,s);
                typename OtherMapper::LinearMapper r = other.getLinearMapper(s,j);
                for (Index i3=0; i3<k; ++i3)
                  b += conj(l[i3]) * r(i3);

                other(i,j) = (other(i,j) - b)*a;
              }
              else
              {
                Scalar& otherij = other(i,j);
                otherij *= a;
                Scalar b = otherij;
                typename OtherMapper::LinearMapper r = other.getLinearMapper(s,j);
                typename TriMapper::LinearMapper l = tri.getLinearMapper(s,i);
                for (Index i3=0;i3<rs;++i3)
                  r(i3) -= b * conj(l(i3));
              }
            }
          }

          Index lengthTarget = actual_kc-k1-actualPanelWidth;
          Index startBlock   = IsLower ? k2+k1 : k2-k1-actualPanelWidth;
          Index blockBOffset = IsLower ? k1 : lengthTarget;

          // update the respective rows of B from other
          pack_rhs(blockB+actual_kc*j2, other.getSubMapper(startBlock,j2), actualPanelWidth, actual_cols, actual_kc, blockBOffset);

          // GEBP
          if (lengthTarget>0)
          {
            Index startTarget  = IsLower ? k2+k1+actualPanelWidth : k2-actual_kc;

            pack_lhs(blockA, tri.getSubMapper(startTarget,startBlock), actualPanelWidth, lengthTarget);

            gebp_kernel(other.getSubMapper(startTarget,j2), blockA, blockB+actual_kc*j2, lengthTarget, actualPanelWidth, actual_cols, Scalar(-1),
                        actualPanelWidth, actual_kc, 0, blockBOffset);
          }
        }
      }
      
      // R2 -= A21 * B => GEPP
      {
        Index start = IsLower ? k2+kc : 0;
        Index end   = IsLower ? size : k2-kc;
        for(Index i2=start; i2<end; i2+=mc)
        {
          const Index actual_mc = (std::min)(mc,end-i2);
          if (actual_mc>0)
          {
            pack_lhs(blockA, tri.getSubMapper(i2, IsLower ? k2 : k2-kc), actual_kc, actual_mc);

            gebp_kernel(other.getSubMapper(i2, 0), blockA, blockB, actual_mc, actual_kc, cols, Scalar(-1), -1, -1, 0, 0);
          }
        }
      }
    }
  }